

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_geom.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_geom::load_v9(xr_level_geom *this,xr_reader *r)

{
  xr_vbuf_vec_it xVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  d3d_vertex_element *ve_00;
  d3d_vertex_element *pdVar5;
  pointer pxVar6;
  pointer this_00;
  __normal_iterator<xray_re::xr_ibuf_*,_std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>_>
  local_70;
  xr_ibuf_vec_it end_2;
  xr_ibuf_vec_it it_2;
  size_t n;
  iterator iStack_50;
  uint32_t fvf;
  xr_vbuf_vec_it end_1;
  xr_vbuf_vec_it it_1;
  size_t n_ve;
  d3d_vertex_element *ve;
  xr_vbuf_vec_it end;
  xr_vbuf_vec_it it;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_geom *this_local;
  
  it._M_current = (xr_vbuf *)xr_reader::open_chunk(r,0xc);
  if (it._M_current == (xr_vbuf *)0x0) {
    it._M_current = (xr_vbuf *)xr_reader::open_chunk(r,4);
    if (it._M_current == (xr_vbuf *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                    ,0x22,"void xray_re::xr_level_geom::load_v9(xr_reader &)");
    }
    uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
    std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
              (&this->m_vbufs,(ulong)uVar3);
    end_1._M_current =
         (xr_vbuf *)
         std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::begin(&this->m_vbufs);
    iStack_50 = std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::end
                          (&this->m_vbufs);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&end_1,&stack0xffffffffffffffb0);
      if (!bVar2) break;
      uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
      uVar4 = xr_reader::r_u32((xr_reader *)it._M_current);
      pxVar6 = __gnu_cxx::
               __normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
               ::operator->(&end_1);
      xr_vbuf::load_d3d7(pxVar6,(xr_reader *)it._M_current,(ulong)uVar4,uVar3);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
      ::operator++(&end_1);
    }
    xr_reader::close_chunk(r,(xr_reader **)&it);
  }
  else {
    uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
    std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
              (&this->m_vbufs,(ulong)uVar3);
    end._M_current =
         (xr_vbuf *)
         std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::begin(&this->m_vbufs);
    ve = (d3d_vertex_element *)
         std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::end(&this->m_vbufs);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&end,(__normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
                               *)&ve);
      if (!bVar2) break;
      ve_00 = xr_reader::skip<xray_re::d3d_vertex_element>((xr_reader *)it._M_current,1);
      it_1._M_current = (xr_vbuf *)0x1;
      while( true ) {
        pdVar5 = xr_reader::skip<xray_re::d3d_vertex_element>((xr_reader *)it._M_current,1);
        if (pdVar5->type == '\x11') break;
        it_1._M_current =
             (xr_vbuf *)((long)&((it_1._M_current)->super_xr_flexbuf)._vptr_xr_flexbuf + 1);
      }
      pxVar6 = __gnu_cxx::
               __normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
               ::operator->(&end);
      xVar1 = it;
      uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
      xr_vbuf::load_d3d9(pxVar6,(xr_reader *)xVar1._M_current,(ulong)uVar3,ve_00,
                         (size_t)it_1._M_current);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
      ::operator++(&end);
    }
    xr_reader::close_chunk(r,(xr_reader **)&it);
  }
  it._M_current = (xr_vbuf *)xr_reader::open_chunk(r,0xb);
  if (it._M_current != (xr_vbuf *)0x0) {
    uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
    std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::resize
              (&this->m_ibufs,(ulong)uVar3);
    end_2._M_current =
         (xr_ibuf *)
         std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::begin(&this->m_ibufs);
    local_70._M_current =
         (xr_ibuf *)
         std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::end(&this->m_ibufs);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&end_2,&local_70);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<xray_re::xr_ibuf_*,_std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>_>
                ::operator->(&end_2);
      xVar1 = it;
      uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
      xr_ibuf::load(this_00,(xr_reader *)xVar1._M_current,(ulong)uVar3);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_ibuf_*,_std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>_>
      ::operator++(&end_2);
    }
    xr_reader::close_chunk(r,(xr_reader **)&it);
    return;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                ,0x2d,"void xray_re::xr_level_geom::load_v9(xr_reader &)");
}

Assistant:

void xr_level_geom::load_v9(xr_reader& r)
{
	xr_reader* s = r.open_chunk(FSL9_VB);
	if (s) {
		m_vbufs.resize(s->r_u32());
		for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
			const d3d_vertex_element *ve = s->skip<d3d_vertex_element>();
			size_t n_ve = 1;
			for (; s->skip<d3d_vertex_element>()->type != D3D_VE_TYPE_UNUSED; ++n_ve) {}
			it->load_d3d9(*s, s->r_u32(), ve, n_ve);
		}
		r.close_chunk(s);
	} else {
		s = r.open_chunk(FSL9_VB_OLD);
		xr_assert(s);
		m_vbufs.resize(s->r_u32());
		for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
			uint32_t fvf = s->r_u32();
			size_t n = s->r_u32();
			it->load_d3d7(*s, n, fvf);
		}
		r.close_chunk(s);
	}

	s = r.open_chunk(FSL9_IB);
	xr_assert(s);
	m_ibufs.resize(s->r_u32());
	for (xr_ibuf_vec_it it = m_ibufs.begin(), end = m_ibufs.end(); it != end; ++it)
		it->load(*s, s->r_u32());
	r.close_chunk(s);
}